

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

void tvm::runtime::SaveMetaDataToFile
               (string *file_name,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
               *fmap)

{
  ostream *poVar1;
  allocator<char> local_3e1;
  string local_3e0;
  string version;
  JSONWriter writer;
  ofstream fs;
  byte abStack_1f8 [480];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&version,"0.1.0",(allocator<char> *)&fs);
  std::ofstream::ofstream(&fs,(file_name->_M_dataplus)._M_p,_S_out);
  if ((abStack_1f8[*(long *)(_fs + -0x18)] & 5) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&writer,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/file_util.cc"
               ,0x93);
    poVar1 = std::operator<<((ostream *)&writer,"Check failed: !fs.fail()");
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"Cannot open file ");
    std::operator<<(poVar1,(string *)file_name);
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&writer);
  }
  writer.scope_multi_line_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  writer.scope_multi_line_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  writer.scope_multi_line_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  writer.scope_counter_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  writer.scope_counter_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  writer.scope_counter_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writer.scope_multi_line_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  writer.scope_multi_line_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  writer.os_ = (ostream *)&fs;
  dmlc::JSONWriter::BeginObject(&writer,true);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"tvm_version",&local_3e1);
  dmlc::JSONWriter::WriteObjectKeyValue<std::__cxx11::string>(&writer,&local_3e0,&version);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"func_info",&local_3e1);
  dmlc::JSONWriter::
  WriteObjectKeyValue<std::unordered_map<std::__cxx11::string,tvm::runtime::FunctionInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tvm::runtime::FunctionInfo>>>>
            (&writer,&local_3e0,fmap);
  std::__cxx11::string::~string((string *)&local_3e0);
  dmlc::JSONWriter::EndObject(&writer);
  std::ofstream::close();
  dmlc::JSONWriter::~JSONWriter(&writer);
  std::ofstream::~ofstream(&fs);
  std::__cxx11::string::~string((string *)&version);
  return;
}

Assistant:

void SaveMetaDataToFile(
    const std::string &file_name,
    const std::unordered_map<std::string, FunctionInfo> &fmap) {
  std::string version = "0.1.0";
  std::ofstream fs(file_name.c_str());
  CHECK(!fs.fail()) << "Cannot open file " << file_name;
  dmlc::JSONWriter writer(&fs);
  writer.BeginObject();
  writer.WriteObjectKeyValue("tvm_version", version);
  writer.WriteObjectKeyValue("func_info", fmap);
  writer.EndObject();
  fs.close();
}